

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool IsMemoryStoreToVariable(VmInstruction *instruction,VariableData *variable)

{
  VmValue **ppVVar1;
  VmConstant *pVVar2;
  VmConstant *constant_1;
  VmConstant *constant;
  VariableData *variable_local;
  VmInstruction *instruction_local;
  
  if ((7 < (int)instruction->cmd) && ((int)instruction->cmd < 0xf)) {
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,0);
    pVVar2 = getType<VmConstant>(*ppVVar1);
    if (pVVar2 != (VmConstant *)0x0) {
      return pVVar2->container == variable;
    }
  }
  if (instruction->cmd == VM_INST_MEM_COPY) {
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,0);
    pVVar2 = getType<VmConstant>(*ppVVar1);
    if (pVVar2 != (VmConstant *)0x0) {
      return pVVar2->container == variable;
    }
  }
  return false;
}

Assistant:

bool IsMemoryStoreToVariable(VmInstruction *instruction, VariableData *variable)
{
	if(instruction->cmd >= VM_INST_STORE_BYTE && instruction->cmd <= VM_INST_STORE_STRUCT)
	{
		if(VmConstant *constant = getType<VmConstant>(instruction->arguments[0]))
			return constant->container == variable;
	}

	if(instruction->cmd == VM_INST_MEM_COPY)
	{
		if(VmConstant *constant = getType<VmConstant>(instruction->arguments[0]))
			return constant->container == variable;
	}

	return false;
}